

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void QLibraryStore::cleanup(EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  QLibraryStore *this;
  _Base_ptr p_Var2;
  QDebug *pQVar3;
  LibraryMap *__range1;
  QLibraryPrivate *this_00;
  long in_FS_OFFSET;
  char *local_38;
  
  this = qt_library_data;
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  if (qt_library_data != (QLibraryStore *)0x0) {
    p_Var1 = &(qt_library_data->libraryMap)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var2 = (qt_library_data->libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
    {
      this_00 = (QLibraryPrivate *)p_Var2[1]._M_right;
      if ((this_00->libraryRefCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 1) {
        if ((this_00->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i < 1) {
          p_Var2[1]._M_right = (_Base_ptr)0x0;
LAB_004379dc:
          QLibraryPrivate::~QLibraryPrivate(this_00);
        }
        else {
          (this_00->libraryUnloadCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 1;
          QLibraryPrivate::unload((QLibraryPrivate *)p_Var2[1]._M_right,UnloadSys);
          this_00 = (QLibraryPrivate *)p_Var2[1]._M_right;
          p_Var2[1]._M_right = (_Base_ptr)0x0;
          if (this_00 != (QLibraryPrivate *)0x0) goto LAB_004379dc;
          this_00 = (QLibraryPrivate *)0x0;
        }
        operator_delete(this_00,0xb0);
      }
    }
    lcDebugLibrary();
    if (((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) != 0) {
      for (p_Var2 = (this->libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
      {
        if (p_Var2[1]._M_right != (_Base_ptr)0x0) {
          lcDebugLibrary();
          if (((byte)lcDebugLibrary::category.super_QLoggingCategory.field_2.bools.enabledDebug.
                     _q_value._M_base._M_i & 1) != 0) {
            QMessageLogger::debug((QMessageLogger *)&stack0xffffffffffffffc0);
            pQVar3 = QDebug::operator<<((QDebug *)&stack0xffffffffffffffc0,"On QtCore unload,");
            pQVar3 = QDebug::operator<<(pQVar3,(QString *)p_Var2[1]._M_right);
            pQVar3 = QDebug::operator<<(pQVar3,"was leaked, with");
            pQVar3 = QDebug::operator<<(pQVar3,*(int *)&p_Var2[1]._M_right[5].field_0x4);
            QDebug::operator<<(pQVar3,"users");
            QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
          }
        }
      }
    }
    ~QLibraryStore(this);
    operator_delete(this,0x30);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QLibraryStore::cleanup()
{
    QLibraryStore *data = qt_library_data;
    if (!data)
        return;

    // find any libraries that are still loaded but have a no one attached to them
    for (auto &[_, lib] : data->libraryMap) {
        if (lib->libraryRefCount.loadRelaxed() == 1) {
            if (lib->libraryUnloadCount.loadRelaxed() > 0) {
                Q_ASSERT(lib->pHnd.loadRelaxed());
                lib->libraryUnloadCount.storeRelaxed(1);
#if defined(Q_OS_DARWIN)
                // We cannot fully unload libraries, as we don't know if there are
                // lingering references (in system threads e.g.) to Objective-C classes
                // defined in the library.
                lib->unload(QLibraryPrivate::NoUnloadSys);
#else
                lib->unload();
#endif
            }
            delete std::exchange(lib, nullptr);
        }
    }

    // dump all objects that remain
    if (lcDebugLibrary().isDebugEnabled()) {
        for (auto &[_, lib] : data->libraryMap) {
            if (lib)
                qCDebug(lcDebugLibrary)
                        << "On QtCore unload," << lib->fileName << "was leaked, with"
                        << lib->libraryRefCount.loadRelaxed() << "users";
        }
    }

    delete data;
}